

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O3

Score __thiscall
indigox::algorithm::FPTOptimisation::ScoreVertex(FPTOptimisation *this,MolVertPair v,VertMask *f)

{
  Score SVar1;
  size_type sVar2;
  mapped_type *ppvVar3;
  ElnVertex u;
  ElnDist actualDist;
  VertMask placed;
  mapped_type local_70;
  ElnDist local_68;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  key_type local_28;
  
  SVar1 = Options::AssignElectrons::INF;
  local_28.second = v.second;
  local_28.first = v.first;
  boost::operator&(&local_48,f,&this->placedMask_);
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(&local_48);
  if (sVar2 <= ((this->super_ElectronOptimisationAlgorithm).parent_)->electronsToAdd_) {
    VertMaskToElnDist(&local_68,this,&local_48);
    ppvVar3 = std::
              map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
              ::at(&(this->super_ElectronOptimisationAlgorithm).mvp2ev_,&local_28);
    local_70 = *ppvVar3;
    ElectronOptimisationAlgorithm::SetElectronDistribution
              (&this->super_ElectronOptimisationAlgorithm,&local_68);
    ElectronOptimisationAlgorithm::DetermineFormalCharges
              (&this->super_ElectronOptimisationAlgorithm);
    SVar1 = ElectronOptimisationAlgorithm::CalculateVertexEnergy
                      (&this->super_ElectronOptimisationAlgorithm,&local_70);
    if (local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return SVar1;
}

Assistant:

Score FPTOptimisation::ScoreVertex(MolVertPair v, VertMask f)
{  
  Score s = opt_::INF;
  const VertMask placed = f & placedMask_;
  if (placed.count() > parent_->electronsToAdd_) return s;
  
  ElnDist actualDist = VertMaskToElnDist(placed);
  
  ElnVertex u = mvp2ev_.at(v);
  SetElectronDistribution(actualDist);
  DetermineFormalCharges();
  s = CalculateVertexEnergy(u);
  return s;
}